

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.cpp
# Opt level: O2

void __thiscall chatter::Protocol::update(Protocol *this,Peer *peer,uint64_t timestamp)

{
  Host *pHVar1;
  ptr e;
  __shared_ptr<chatter::Event,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<chatter::Event,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  if (peer != (Peer *)0x0) {
    if (peer->m_state - CONNECTION_REQUESTED < 3) {
      if (timestamp - peer->m_connect_ts < 0x1389) {
        do_resends(this,peer,timestamp);
        return;
      }
      if (peer->m_is_incoming_connection == false) {
        Event::create((Event *)&e,PEER_UNABLE_TO_CONNECT);
        ((e.super___shared_ptr<chatter::Event,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->address).m_port
             = (peer->m_address).m_port;
        ((e.super___shared_ptr<chatter::Event,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->address).
        m_address = (peer->m_address).m_address;
        pHVar1 = this->m_host;
        std::__shared_ptr<chatter::Event,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_40,(__shared_ptr<chatter::Event,_(__gnu_cxx::_Lock_policy)2> *)&e);
        Host::queue_event(pHVar1,(ptr *)&local_40);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&e.super___shared_ptr<chatter::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      }
      Peer::reset(peer);
    }
    else if (peer->m_state == CONNECTED) {
      if (20000 < timestamp - peer->m_last_recv_ts) {
        Event::create((Event *)&e,PEER_TIMED_OUT);
        ((e.super___shared_ptr<chatter::Event,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->address).m_port
             = (peer->m_address).m_port;
        ((e.super___shared_ptr<chatter::Event,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->address).
        m_address = (peer->m_address).m_address;
        pHVar1 = this->m_host;
        std::__shared_ptr<chatter::Event,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_50,(__shared_ptr<chatter::Event,_(__gnu_cxx::_Lock_policy)2> *)&e);
        Host::queue_event(pHVar1,(ptr *)&local_50);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
        Peer::reset(peer);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&e.super___shared_ptr<chatter::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      }
      if (1000 < timestamp - peer->m_last_rtt_ts) {
        service_rtt(this,peer,timestamp);
      }
      do_resends(this,peer,timestamp);
    }
  }
  return;
}

Assistant:

void Protocol::update(Peer* peer, uint64_t timestamp)
{
    if (!peer)
        return;

    switch (peer->m_state) {
        case PeerState::DISCONNECTED:
            return; /* We shouldn't be given a disconnected peer o.O */

        case PeerState::CONNECTION_REQUESTED:
        case PeerState::CONNECTION_RESPONDED:
        case PeerState::CONNECTION_ACKNOWLEDGED:
            {
                /* Check for long-running connection attempts and kill them */
                uint64_t time_since_connect = timestamp - peer->m_connect_ts;
                if (time_since_connect > kConnectTimeOut) {
                    if (!peer->m_is_incoming_connection) {
                        auto e = Event::create(EventType::PEER_UNABLE_TO_CONNECT);
                        e->address = peer->m_address;
                        m_host->queue_event(e);
                    }
                    peer->reset();
                    return;
                }
                /* Reliable packet re-sends */
                do_resends(peer, timestamp);
            }
            break;

        case PeerState::CONNECTED:
            {
                /* Disconnect detection */
                if (detect_disconnect(peer, timestamp)) {
                    auto e = Event::create(EventType::PEER_TIMED_OUT);
                    e->address = peer->m_address;
                    m_host->queue_event(e);
                    peer->reset();
                }

                /* Keep RTT calculations happening */
                uint64_t time_since_last_rtt = timestamp - peer->m_last_rtt_ts;
                if (time_since_last_rtt > kPingInterval)
                    service_rtt(peer, timestamp);

                /* Reliable packet re-sends */
                do_resends(peer, timestamp);
            }
            break;

        default:
            break;
    }
}